

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall
dd::ProcessThreadImpl::PostDelayedTask
          (ProcessThreadImpl *this,
          unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *task,
          uint32_t milliseconds)

{
  long lVar1;
  bool bVar2;
  rep rVar3;
  const_reference pvVar4;
  bool local_59;
  AutoLock local_38;
  AutoLock l;
  long lStack_28;
  bool recalulate_wakeup_time;
  int64_t run_at_ms;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *puStack_18;
  uint32_t milliseconds_local;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *task_local;
  ProcessThreadImpl *this_local;
  
  run_at_ms._4_4_ = milliseconds;
  puStack_18 = task;
  task_local = (unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)this;
  rVar3 = GetCurrentTick();
  lStack_28 = rVar3 + (ulong)run_at_ms._4_4_;
  l._lock._7_1_ = 0;
  AutoLock::AutoLock(&local_38,&this->_lock);
  bVar2 = std::
          priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
          ::empty(&this->_delayed_tasks);
  lVar1 = lStack_28;
  local_59 = true;
  if (!bVar2) {
    pvVar4 = std::
             priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
             ::top(&this->_delayed_tasks);
    local_59 = lVar1 < pvVar4->run_at_ms;
  }
  l._lock._7_1_ = local_59;
  std::
  priority_queue<dd::ProcessThreadImpl::DelayedTask,std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,std::less<dd::ProcessThreadImpl::DelayedTask>>
  ::emplace<long&,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>
            ((priority_queue<dd::ProcessThreadImpl::DelayedTask,std::vector<dd::ProcessThreadImpl::DelayedTask,std::allocator<dd::ProcessThreadImpl::DelayedTask>>,std::less<dd::ProcessThreadImpl::DelayedTask>>
              *)&this->_delayed_tasks,&stack0xffffffffffffffd8,task);
  AutoLock::~AutoLock(&local_38);
  if ((l._lock._7_1_ & 1) != 0) {
    Event::Set(&this->_wake_up);
  }
  return;
}

Assistant:

void ProcessThreadImpl::PostDelayedTask(std::unique_ptr<QueuedTask> task, uint32_t milliseconds) {
		int64_t run_at_ms = GetCurrentTick() + milliseconds;
		bool recalulate_wakeup_time = false;
		{
			AutoLock l(_lock);
			recalulate_wakeup_time = _delayed_tasks.empty() || run_at_ms < _delayed_tasks.top().run_at_ms;
			_delayed_tasks.emplace(run_at_ms, std::move(task));
		}
		if (recalulate_wakeup_time) {
			_wake_up.Set();
		}
	}